

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

void __thiscall apngasm::APNGAsm::~APNGAsm(APNGAsm *this)

{
  pointer pCVar1;
  pointer pAVar2;
  
  reset(this);
  pCVar1 = (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->_info_chunks).
                                 super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  pAVar2 = (this->_frames).
           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pAVar2 != (pointer)0x0) {
    operator_delete(pAVar2,(long)(this->_frames).
                                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar2);
    return;
  }
  return;
}

Assistant:

APNGAsm::~APNGAsm()
  {
    reset();
  }